

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::EmptyArgumentExpression>
          (PropagationVisitor *this,EmptyArgumentExpression *expr)

{
  bool bVar1;
  Expression *in_RSI;
  Type *in_RDI;
  ASTContext *unaff_retaddr;
  SourceRange in_stack_00000010;
  Expression *result;
  bool needConversion;
  Expression *in_stack_ffffffffffffffa0;
  Type *local_28;
  not_null<const_slang::ast::Type_*> in_stack_ffffffffffffffe0;
  Type *rhs;
  Type *in_stack_fffffffffffffff8;
  
  rhs = in_RDI;
  bVar1 = Expression::bad(in_stack_ffffffffffffffa0);
  if (!bVar1) {
    bVar1 = Type::isError((Type *)0x688cc5);
    if (bVar1) {
      local_28 = (Type *)(in_RDI->super_Symbol).name._M_len;
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                ((not_null<const_slang::ast::Type_*> *)&stack0xffffffffffffffe0,&local_28);
      (in_RSI->type).ptr = in_stack_ffffffffffffffe0.ptr;
    }
    else {
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x688d21);
      bVar1 = Type::isEquivalent(in_stack_fffffffffffffff8,rhs);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        in_RSI = ConversionExpression::makeImplicit
                           (unaff_retaddr,in_stack_fffffffffffffff8,
                            (ConversionKind)((ulong)rhs >> 0x20),in_RSI,
                            (Expression *)in_stack_ffffffffffffffe0.ptr,in_stack_00000010);
      }
    }
  }
  return in_RSI;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (requires { expr.propagateType(context, newType, opRange, conversionKind); }) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::ValueRange) {

                if (!needConversion) {
                    // If we don't need a conversion here we still need to call propagateType as
                    // one of our child expressions may still need conversion. However, we shouldn't
                    // pass along our given opRange since we didn't need the conversion here, so our
                    // parent operator isn't relevant. We should try to refigure an opRange for our
                    // most immediate parent expression instead.
                    updateRange(expr);
                }

                if (expr.propagateType(context, newType, opRange, conversionKind)) {
                    // We propagated the type successfully so we don't need a conversion.
                    // We should however clear out any constant value that may have been
                    // stored here, since it may no longer be valid given the new type.
                    needConversion = false;
                    expr.constant = nullptr;
                }
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            result = &ConversionExpression::makeImplicit(context, newType, conversionKind, expr,
                                                         parentExpr, opRange);
        }

        return *result;
    }